

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopStyleColor(int count)

{
  ImVec4 *pIVar1;
  ImVec4 *pIVar2;
  int iVar3;
  ImGuiColorMod *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiContext *pIVar8;
  long lVar9;
  int iVar10;
  
  pIVar8 = GImGui;
  if (0 < count) {
    iVar10 = count + 1;
    do {
      lVar9 = (long)(pIVar8->ColorModifiers).Size;
      if (lVar9 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                      ,0x538,"T &ImVector<ImGuiColorMod>::back() [T = ImGuiColorMod]");
      }
      pIVar4 = (pIVar8->ColorModifiers).Data;
      pIVar2 = &pIVar4[lVar9 + -1].BackupValue;
      fVar5 = pIVar2->y;
      fVar6 = pIVar2->z;
      fVar7 = pIVar2->w;
      pIVar1 = (pIVar8->Style).Colors + pIVar4[lVar9 + -1].Col;
      pIVar1->x = pIVar2->x;
      pIVar1->y = fVar5;
      pIVar1->z = fVar6;
      pIVar1->w = fVar7;
      iVar3 = (pIVar8->ColorModifiers).Size;
      if (iVar3 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                      ,0x544,"void ImVector<ImGuiColorMod>::pop_back() [T = ImGuiColorMod]");
      }
      (pIVar8->ColorModifiers).Size = iVar3 + -1;
      iVar10 = iVar10 + -1;
    } while (1 < iVar10);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorModifiers.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorModifiers.pop_back();
        count--;
    }
}